

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::redisplay_range(Fl_Text_Display *this,int startpos,int endpos)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->damage_range1_start;
  uVar2 = this->damage_range1_end;
  if ((uVar1 & uVar2) == 0xffffffff) {
    this->damage_range1_start = startpos;
  }
  else {
    if (((int)uVar2 < startpos || startpos < (int)uVar1) &&
       ((int)uVar2 < endpos || endpos < (int)uVar1)) {
      uVar1 = this->damage_range2_start;
      uVar2 = this->damage_range2_end;
      if ((uVar1 & uVar2) == 0xffffffff) {
        this->damage_range2_start = startpos;
      }
      else {
        if ((int)uVar1 < startpos) {
          startpos = uVar1;
        }
        this->damage_range2_start = startpos;
        if (endpos < (int)uVar2) {
          endpos = uVar2;
        }
      }
      this->damage_range2_end = endpos;
      goto LAB_001d216a;
    }
    if ((int)uVar1 < startpos) {
      startpos = uVar1;
    }
    this->damage_range1_start = startpos;
    if (endpos < (int)uVar2) {
      endpos = uVar2;
    }
  }
  this->damage_range1_end = endpos;
LAB_001d216a:
  Fl_Widget::damage((Fl_Widget *)this,'\x04');
  return;
}

Assistant:

void Fl_Text_Display::redisplay_range(int startpos, int endpos) {
  IS_UTF8_ALIGNED2(buffer(), startpos)
  IS_UTF8_ALIGNED2(buffer(), endpos)

  if (damage_range1_start == -1 && damage_range1_end == -1) {
    damage_range1_start = startpos;
    damage_range1_end = endpos;
  } else if ((startpos >= damage_range1_start && startpos <= damage_range1_end) ||
             (endpos >= damage_range1_start && endpos <= damage_range1_end)) {
    damage_range1_start = min(damage_range1_start, startpos);
    damage_range1_end = max(damage_range1_end, endpos);
  } else if (damage_range2_start == -1 && damage_range2_end == -1) {
    damage_range2_start = startpos;
    damage_range2_end = endpos;
  } else {
    damage_range2_start = min(damage_range2_start, startpos);
    damage_range2_end = max(damage_range2_end, endpos);
  }
  damage(FL_DAMAGE_SCROLL);
}